

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptorTables::AddFieldByNumber
          (FileDescriptorTables *this,FieldDescriptor *field)

{
  ctrl_t *pcVar1;
  FieldsByNumberSet *common;
  Descriptor *this_00;
  undefined1 (*pauVar2) [16];
  ushort uVar3;
  ushort x;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  iterator iVar6;
  bool bVar7;
  uint uVar8;
  uint32_t uVar9;
  FieldDescriptor *pFVar10;
  NonIterableBitMask<unsigned_long,_8,_3> NVar11;
  CommonFields *common_00;
  ParentNumberHash *this_01;
  FieldDescriptor **ppFVar12;
  undefined1 (*pauVar13) [16];
  slot_type *ppFVar14;
  size_t sVar15;
  ctrl_t *pcVar16;
  slot_type *slot;
  slot_type *slot_00;
  slot_type *slot_01;
  anon_union_8_1_a8a14541_for_iterator_2 aVar17;
  slot_type *slot_02;
  slot_type *slot_03;
  slot_type *slot_04;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  PolicyFunctions *in_R9;
  ulong uVar18;
  FieldDescriptor **ppFVar19;
  ushort uVar20;
  size_t i;
  ulong uVar21;
  undefined4 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i match;
  ctrl_t cVar25;
  ctrl_t cVar28;
  ctrl_t cVar29;
  ctrl_t cVar30;
  ctrl_t cVar31;
  ctrl_t cVar32;
  ctrl_t cVar33;
  ctrl_t cVar34;
  ctrl_t cVar35;
  ctrl_t cVar36;
  ctrl_t cVar37;
  ctrl_t cVar38;
  ctrl_t cVar39;
  ctrl_t cVar40;
  ctrl_t cVar41;
  ctrl_t cVar42;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  iterator iVar43;
  FindInfo target;
  probe_seq<16UL> seq;
  anon_union_8_1_a8a14541_for_iterator_2 local_b8;
  anon_class_24_3_2b146c49 local_b0;
  FieldDescriptor **local_98;
  FieldDescriptor *field_local;
  undefined1 local_88 [16];
  size_t hash_of_arg;
  undefined8 local_68;
  ctrl_t cStack_60;
  ctrl_t cStack_5f;
  ctrl_t cStack_5e;
  ctrl_t cStack_5d;
  ctrl_t cStack_5c;
  ctrl_t cStack_5b;
  ctrl_t cStack_5a;
  ctrl_t cStack_59;
  undefined1 local_58 [16];
  iterator local_48;
  size_t hash_of_arg_1;
  
  this_00 = field->containing_type_;
  pFVar10 = field;
  field_local = field;
  if (this_00 != (Descriptor *)0x0) {
    uVar8 = field->number_;
    pFVar10 = (FieldDescriptor *)(ulong)uVar8;
    if ((0 < (int)uVar8) && (uVar8 <= this_00->sequential_field_limit_)) {
      if ((field->field_0x1 & 8) != 0) {
        return false;
      }
      pFVar10 = Descriptor::field(this_00,uVar8 - 1);
      return pFVar10 == field;
    }
  }
  common = &this->fields_by_number_;
  bVar7 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty(&common->
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  if (!bVar7) {
    hash_of_arg = protobuf::(anonymous_namespace)::ParentNumberHash::operator()
                            ((ParentNumberHash *)&field_local,(FieldDescriptor **)pFVar10);
    local_b0.hash_of_arg = &hash_of_arg;
    local_b0.key = &field_local;
    local_b0.this =
         &common->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ;
    bVar7 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    if (bVar7) {
      pFVar10 = (FieldDescriptor *)
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::soo_slot(&common->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          );
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::AssertHashEqConsistent<google::protobuf::FieldDescriptor_*>::anon_class_24_3_2b146c49::
      operator()(&local_b0,(ctrl_t *)pFVar10,slot);
    }
    else {
      sVar15 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::capacity(&common->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
      if (sVar15 < 0x11) {
        ppFVar14 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        seq.index_ = (size_t)local_b0.hash_of_arg;
        seq.offset_ = (size_t)local_b0.this;
        seq.mask_ = (size_t)local_b0.key;
        uVar21 = (this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar2 = (undefined1 (*) [16])
                  (this->fields_by_number_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        if (0xe < uVar21) {
          local_88._0_8_ = this;
          uVar18 = (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_ >> 1;
          uVar21 = uVar18;
          do {
            pauVar13 = pauVar2;
            if (uVar21 == 0) {
              this = (FileDescriptorTables *)local_88._0_8_;
              if (uVar18 < (((FieldsByNumberSet *)(local_88._0_8_ + 0x38))->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ).settings_.
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.size_ >> 1) goto LAB_001c8884;
              goto LAB_001c80cb;
            }
            auVar23 = *pauVar13;
            for (uVar20 = ~((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar23[0xf] >> 7) << 0xf); uVar20 != 0;
                uVar20 = uVar20 - 1 & uVar20) {
              uVar9 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar20);
              if ((char)(*pauVar13)[uVar9] < '\0') goto LAB_001c87ab;
              pFVar10 = (FieldDescriptor *)(ppFVar14 + uVar9);
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::AssertHashEqConsistent<google::protobuf::FieldDescriptor_*>::
              anon_class_24_3_2b146c49::operator()
                        ((anon_class_24_3_2b146c49 *)&seq,(ctrl_t *)pFVar10,slot_01);
              uVar21 = uVar21 - 1;
            }
            ppFVar14 = ppFVar14 + 0x10;
            pauVar2 = pauVar13 + 1;
          } while ((uVar21 == 0) || ((*pauVar13)[0xf] != -1));
          goto LAB_001c8542;
        }
        if (8 < uVar21) goto LAB_001c8865;
        local_48.ctrl_ = *(ctrl_t **)(*pauVar2 + uVar21);
        NVar11.mask_ = (unsigned_long)
                       absl::lts_20250127::container_internal::GroupPortableImpl::MaskFull
                                 ((GroupPortableImpl *)&local_48);
        while( true ) {
          local_48.ctrl_ = (ctrl_t *)NVar11.mask_;
          if (NVar11.mask_ == 0) break;
          uVar9 = absl::lts_20250127::container_internal::NonIterableBitMask<unsigned_long,_8,_3>::
                  LowestBitSet((NonIterableBitMask<unsigned_long,_8,_3> *)&local_48);
          pFVar10 = (FieldDescriptor *)(ppFVar14 + ((ulong)uVar9 - 1));
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::AssertHashEqConsistent<google::protobuf::FieldDescriptor_*>::anon_class_24_3_2b146c49::
          operator()((anon_class_24_3_2b146c49 *)&seq,(ctrl_t *)pFVar10,slot_00);
          NVar11.mask_ = (ulong)(local_48.ctrl_ + -1) & (ulong)local_48.ctrl_;
        }
      }
    }
  }
LAB_001c80cb:
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  bVar7 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::is_soo(&common->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  );
  if (bVar7) {
    bVar7 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::empty(&common->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
    if (bVar7) {
      bVar7 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::is_soo(&common->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      );
      if (!bVar7) {
        __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe3f,
                      "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                     );
      }
      absl::lts_20250127::container_internal::CommonFields::set_full_soo((CommonFields *)common);
      iVar43 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::soo_iterator(&common->
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             );
    }
    else {
      seq.offset_ = (size_t)common;
      seq.mask_ = (size_t)&field_local;
      ppFVar14 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      bVar7 = absl::lts_20250127::container_internal::
              hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::FieldDescriptor_const*>>::EqualElement<google::protobuf::FieldDescriptor*>,google::protobuf::FieldDescriptor_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>>
                        ((EqualElement<google::protobuf::FieldDescriptor_*> *)&seq,ppFVar14);
      if (bVar7) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::soo_iterator(&common->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      );
        return false;
      }
      ppFVar12 = (FieldDescriptor **)0x3;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::resize_impl(common);
      sVar15 = protobuf::(anonymous_namespace)::ParentNumberHash::operator()
                         ((ParentNumberHash *)&field_local,ppFVar12);
      sVar15 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                         (sVar15,8,(CommonFields *)common);
      iVar43 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::iterator_at(&common->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ,sVar15);
    }
  }
  else {
    local_88._0_8_ = this;
    bVar7 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    if (bVar7) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf66,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::FieldDescriptor *]"
                   );
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::prefetch_heap_block
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              );
    common_00 = (CommonFields *)
                protobuf::(anonymous_namespace)::ParentNumberHash::operator()
                          ((ParentNumberHash *)&field_local,(FieldDescriptor **)pFVar10);
    absl::lts_20250127::container_internal::probe(&seq,(CommonFields *)common,(size_t)common_00);
    ppFVar12 = (FieldDescriptor **)
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::control(&common->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        );
    auVar23 = ZEXT216(CONCAT11((char)common_00,(char)common_00) & 0x7f7f);
    auVar23 = pshuflw(auVar23,auVar23,0);
    uVar22 = auVar23._0_4_;
    local_58._4_4_ = uVar22;
    local_58._0_4_ = uVar22;
    local_58._8_4_ = uVar22;
    local_58._12_4_ = uVar22;
    while( true ) {
      pcVar16 = (ctrl_t *)((long)ppFVar12 + seq.offset_);
      auVar23[0] = -(local_58[0] == *pcVar16);
      auVar23[1] = -(local_58[1] == pcVar16[1]);
      auVar23[2] = -(local_58[2] == pcVar16[2]);
      auVar23[3] = -(local_58[3] == pcVar16[3]);
      auVar23[4] = -(local_58[4] == pcVar16[4]);
      auVar23[5] = -(local_58[5] == pcVar16[5]);
      auVar23[6] = -(local_58[6] == pcVar16[6]);
      auVar23[7] = -(local_58[7] == pcVar16[7]);
      auVar23[8] = -(local_58[8] == pcVar16[8]);
      auVar23[9] = -(local_58[9] == pcVar16[9]);
      auVar23[10] = -(local_58[10] == pcVar16[10]);
      auVar23[0xb] = -(local_58[0xb] == pcVar16[0xb]);
      auVar23[0xc] = -(local_58[0xc] == pcVar16[0xc]);
      auVar23[0xd] = -(local_58[0xd] == pcVar16[0xd]);
      auVar23[0xe] = -(local_58[0xe] == pcVar16[0xe]);
      auVar23[0xf] = -(local_58[0xf] == pcVar16[0xf]);
      sVar15 = seq.offset_;
      cVar25 = *pcVar16;
      cVar28 = pcVar16[1];
      cVar29 = pcVar16[2];
      cVar30 = pcVar16[3];
      cVar31 = pcVar16[4];
      cVar32 = pcVar16[5];
      cVar33 = pcVar16[6];
      cVar34 = pcVar16[7];
      cVar35 = pcVar16[8];
      cVar36 = pcVar16[9];
      cVar37 = pcVar16[10];
      cVar38 = pcVar16[0xb];
      cVar39 = pcVar16[0xc];
      cVar40 = pcVar16[0xd];
      cVar41 = pcVar16[0xe];
      cVar42 = pcVar16[0xf];
      for (uVar20 = (ushort)(SUB161(auVar23 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar23[0xf] >> 7) << 0xf; uVar20 != 0; uVar20 = uVar20 - 1 & uVar20) {
        local_68._0_2_ = CONCAT11(cVar28,cVar25);
        local_68._0_3_ = CONCAT12(cVar29,(undefined2)local_68);
        local_68._0_4_ = CONCAT13(cVar30,(undefined3)local_68);
        local_68._0_5_ = CONCAT14(cVar31,(undefined4)local_68);
        local_68._0_6_ = CONCAT15(cVar32,(undefined5)local_68);
        local_68._0_7_ = CONCAT16(cVar33,(undefined6)local_68);
        local_68 = CONCAT17(cVar34,(undefined7)local_68);
        local_98 = ppFVar12;
        cStack_60 = cVar35;
        cStack_5f = cVar36;
        cStack_5e = cVar37;
        cStack_5d = cVar38;
        cStack_5c = cVar39;
        cStack_5b = cVar40;
        cStack_5a = cVar41;
        cStack_59 = cVar42;
        uVar9 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar20);
        local_b0.key = &field_local;
        local_b0.this =
             &common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ;
        ppFVar14 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        sVar15 = seq.offset_;
        i = uVar9 + seq.offset_ & seq.mask_;
        bVar7 = absl::lts_20250127::container_internal::
                hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,void>
                ::
                apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::FieldDescriptor_const*>>::EqualElement<google::protobuf::FieldDescriptor*>,google::protobuf::FieldDescriptor_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>>
                          ((EqualElement<google::protobuf::FieldDescriptor_*> *)&local_b0,
                           ppFVar14 + i);
        if (bVar7) goto LAB_001c8367;
        ppFVar12 = local_98;
        cVar25 = (ctrl_t)local_68;
        cVar28 = local_68._1_1_;
        cVar29 = local_68._2_1_;
        cVar30 = local_68._3_1_;
        cVar31 = local_68._4_1_;
        cVar32 = local_68._5_1_;
        cVar33 = local_68._6_1_;
        cVar34 = local_68._7_1_;
        cVar35 = cStack_60;
        cVar36 = cStack_5f;
        cVar37 = cStack_5e;
        cVar38 = cStack_5d;
        cVar39 = cStack_5c;
        cVar40 = cStack_5b;
        cVar41 = cStack_5a;
        cVar42 = cStack_59;
      }
      auVar26[0] = -(cVar25 == kEmpty);
      auVar26[1] = -(cVar28 == kEmpty);
      auVar26[2] = -(cVar29 == kEmpty);
      auVar26[3] = -(cVar30 == kEmpty);
      auVar26[4] = -(cVar31 == kEmpty);
      auVar26[5] = -(cVar32 == kEmpty);
      auVar26[6] = -(cVar33 == kEmpty);
      auVar26[7] = -(cVar34 == kEmpty);
      auVar26[8] = -(cVar35 == kEmpty);
      auVar26[9] = -(cVar36 == kEmpty);
      auVar26[10] = -(cVar37 == kEmpty);
      auVar26[0xb] = -(cVar38 == kEmpty);
      auVar26[0xc] = -(cVar39 == kEmpty);
      auVar26[0xd] = -(cVar40 == kEmpty);
      auVar26[0xe] = -(cVar41 == kEmpty);
      auVar26[0xf] = -(cVar42 == kEmpty);
      x = (ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe | (ushort)(auVar26[0xf] >> 7) << 0xf;
      if (x != 0) break;
      uVar21 = seq.index_ + 0x10;
      seq.offset_ = seq.index_ + sVar15 + 0x10 & seq.mask_;
      seq.index_ = uVar21;
      sVar15 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::capacity(&common->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
      if (sVar15 < uVar21) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::FieldDescriptor *]"
                     );
      }
    }
    sVar15 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::capacity(&common->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       );
    pcVar16 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::control(&common->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       );
    bVar7 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                      (sVar15,(size_t)common_00,pcVar16);
    if (bVar7) {
      uVar3 = 0xf;
      if (x != 0) {
        for (; x >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar8 = (ushort)((uVar3 ^ 0xfff0) + 0x11) - 1;
    }
    else {
      uVar8 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(x);
    }
    target.probe_length =
         (size_t)absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                 ::GetPolicyFunctions()::value;
    target.offset = seq.index_;
    i = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                  ((container_internal *)common,common_00,uVar8 + seq.offset_ & seq.mask_,target,
                   in_R9);
LAB_001c8367:
    iVar43 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::iterator_at(&common->
                            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ,i);
    if (uVar20 != 0) {
      return false;
    }
    this = (FileDescriptorTables *)local_88._0_8_;
  }
  aVar17 = iVar43.field_1;
  ppFVar19 = (FieldDescriptor **)iVar43.ctrl_;
  ppFVar12 = (FieldDescriptor **)
             (common->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
  (common->
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ).settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9c;
  *aVar17.slot_ = field_local;
  local_48 = iVar43;
  absl::lts_20250127::container_internal::CommonFields::set_capacity
            ((CommonFields *)common,(size_t)ppFVar12);
  this_01 = (ParentNumberHash *)
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::iterator::operator*(&local_48);
  bVar7 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::empty(&common->
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  iVar6.field_1.slot_ = aVar17.slot_;
  iVar6.ctrl_ = (ctrl_t *)local_98;
  if (!bVar7) {
    hash_of_arg_1 = protobuf::(anonymous_namespace)::ParentNumberHash::operator()(this_01,ppFVar12);
    local_b0.hash_of_arg = &hash_of_arg_1;
    local_b0.key = (FieldDescriptor **)this_01;
    local_b0.this =
         &common->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ;
    bVar7 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    if (bVar7) {
      ppFVar12 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::AssertHashEqConsistent<const_google::protobuf::FieldDescriptor_*>::anon_class_24_3_2b146c49
      ::operator()((anon_class_24_3_2b146c49 *)&local_b0,(ctrl_t *)ppFVar12,slot_02);
      iVar6.ctrl_ = (ctrl_t *)local_98;
    }
    else {
      sVar15 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::capacity(&common->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
      iVar6.ctrl_ = (ctrl_t *)local_98;
      if (sVar15 < 0x11) {
        local_58._0_8_ = this_01;
        ppFVar14 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        seq.index_ = (size_t)local_b0.hash_of_arg;
        seq.offset_ = (size_t)local_b0.this;
        seq.mask_ = (size_t)local_b0.key;
        uVar21 = (this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar2 = (undefined1 (*) [16])
                  (this->fields_by_number_).
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  .settings_.
                  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                  value.heap_or_soo_.heap.control;
        if (0xe < uVar21) {
          local_88._0_8_ = this;
          uVar21 = (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_ >> 1;
          local_68 = uVar21;
          iVar6 = iVar43;
          do {
            pauVar13 = pauVar2;
            local_b8 = iVar6.field_1;
            local_98 = (FieldDescriptor **)iVar6.ctrl_;
            if (uVar21 == 0) {
              ppFVar19 = local_98;
              if (local_68 < *(ulong *)(local_88._0_8_ + 0x40) >> 1) {
LAB_001c8884:
                __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7aa,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              goto LAB_001c857d;
            }
            auVar23 = *pauVar13;
            uVar20 = ~((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar23[0xf] >> 7) << 0xf);
            while( true ) {
              iVar43.field_1.slot_ = local_b8.slot_;
              iVar43.ctrl_ = (ctrl_t *)local_98;
              iVar6.field_1.slot_ = local_b8.slot_;
              iVar6.ctrl_ = (ctrl_t *)local_98;
              if (uVar20 == 0) break;
              uVar9 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar20);
              if ((char)(*pauVar13)[uVar9] < '\0') {
LAB_001c87ab:
                __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x79d,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
              ppFVar12 = ppFVar14 + uVar9;
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::AssertHashEqConsistent<const_google::protobuf::FieldDescriptor_*>::
              anon_class_24_3_2b146c49::operator()
                        ((anon_class_24_3_2b146c49 *)&seq,(ctrl_t *)ppFVar12,slot_04);
              uVar21 = uVar21 - 1;
              uVar20 = uVar20 - 1 & uVar20;
            }
            ppFVar14 = ppFVar14 + 0x10;
            pauVar2 = pauVar13 + 1;
          } while ((uVar21 == 0) || (iVar6 = iVar43, (*pauVar13)[0xf] != -1));
LAB_001c8542:
          __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7a5,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                       );
        }
        if (8 < uVar21) {
LAB_001c8865:
          seq.index_ = (size_t)local_b0.hash_of_arg;
          __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x78b,
                        "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                       );
        }
        hash_of_arg = *(size_t *)(*pauVar2 + uVar21);
        for (hash_of_arg = (size_t)absl::lts_20250127::container_internal::GroupPortableImpl::
                                   MaskFull((GroupPortableImpl *)&hash_of_arg);
            iVar6.ctrl_ = (ctrl_t *)local_98, hash_of_arg != 0;
            hash_of_arg = hash_of_arg - 1 & hash_of_arg) {
          uVar9 = absl::lts_20250127::container_internal::NonIterableBitMask<unsigned_long,_8,_3>::
                  LowestBitSet((NonIterableBitMask<unsigned_long,_8,_3> *)&hash_of_arg);
          ppFVar12 = ppFVar14 + ((ulong)uVar9 - 1);
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::AssertHashEqConsistent<const_google::protobuf::FieldDescriptor_*>::
          anon_class_24_3_2b146c49::operator()
                    ((anon_class_24_3_2b146c49 *)&seq,(ctrl_t *)ppFVar12,slot_03);
        }
LAB_001c857d:
        this_01 = (ParentNumberHash *)local_58._0_8_;
      }
    }
  }
  local_b8 = iVar6.field_1;
  local_98 = (FieldDescriptor **)iVar6.ctrl_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  bVar7 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::is_soo(&common->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  );
  if (bVar7) {
    bVar7 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    if (!bVar7) {
      __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe21,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_soo(const key_arg<K> &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = const google::protobuf::FieldDescriptor *]"
                   );
    }
    bVar7 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::empty(&common->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   );
    if (!bVar7) {
      seq.offset_ = (size_t)common;
      seq.mask_ = (size_t)this_01;
      ppFVar14 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&common->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      bVar7 = absl::lts_20250127::container_internal::
              hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::FieldDescriptor_const*>>::EqualElement<google::protobuf::FieldDescriptor_const*>,google::protobuf::FieldDescriptor_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>>
                        ((EqualElement<const_google::protobuf::FieldDescriptor_*> *)&seq,ppFVar14);
      if (bVar7) {
        seq._0_16_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::soo_iterator(&common->
                                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   );
        local_b0.key = ppFVar19;
        goto LAB_001c8767;
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::AssertNotDebugCapacity
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              );
    auVar4._8_8_ = 0;
    auVar4._0_8_ = extraout_RDX;
    seq._0_16_ = auVar4 << 0x40;
    local_b0.key = ppFVar19;
  }
  else {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::prefetch_heap_block
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              );
    sVar15 = protobuf::(anonymous_namespace)::ParentNumberHash::operator()(this_01,ppFVar12);
    bVar7 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    );
    if (bVar7) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe2a,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = const google::protobuf::FieldDescriptor *]"
                   );
    }
    local_58._0_8_ = this_01;
    local_98 = ppFVar19;
    absl::lts_20250127::container_internal::probe(&seq,(CommonFields *)common,sVar15);
    pcVar16 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::control(&common->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       );
    auVar23 = ZEXT216(CONCAT11((char)sVar15,(char)sVar15) & 0x7f7f);
    auVar23 = pshuflw(auVar23,auVar23,0);
    uVar22 = auVar23._0_4_;
    local_88._4_4_ = uVar22;
    local_88._0_4_ = uVar22;
    local_88._8_4_ = uVar22;
    local_88._12_4_ = uVar22;
    while( true ) {
      pcVar1 = pcVar16 + seq.offset_;
      auVar24[0] = -(local_88[0] == *pcVar1);
      auVar24[1] = -(local_88[1] == pcVar1[1]);
      auVar24[2] = -(local_88[2] == pcVar1[2]);
      auVar24[3] = -(local_88[3] == pcVar1[3]);
      auVar24[4] = -(local_88[4] == pcVar1[4]);
      auVar24[5] = -(local_88[5] == pcVar1[5]);
      auVar24[6] = -(local_88[6] == pcVar1[6]);
      auVar24[7] = -(local_88[7] == pcVar1[7]);
      auVar24[8] = -(local_88[8] == pcVar1[8]);
      auVar24[9] = -(local_88[9] == pcVar1[9]);
      auVar24[10] = -(local_88[10] == pcVar1[10]);
      auVar24[0xb] = -(local_88[0xb] == pcVar1[0xb]);
      auVar24[0xc] = -(local_88[0xc] == pcVar1[0xc]);
      auVar24[0xd] = -(local_88[0xd] == pcVar1[0xd]);
      auVar24[0xe] = -(local_88[0xe] == pcVar1[0xe]);
      auVar24[0xf] = -(local_88[0xf] == pcVar1[0xf]);
      sVar15 = seq.offset_;
      cVar25 = *pcVar1;
      cVar28 = pcVar1[1];
      cVar29 = pcVar1[2];
      cVar30 = pcVar1[3];
      cVar31 = pcVar1[4];
      cVar32 = pcVar1[5];
      cVar33 = pcVar1[6];
      cVar34 = pcVar1[7];
      cVar35 = pcVar1[8];
      cVar36 = pcVar1[9];
      cVar37 = pcVar1[10];
      cVar38 = pcVar1[0xb];
      cVar39 = pcVar1[0xc];
      cVar40 = pcVar1[0xd];
      cVar41 = pcVar1[0xe];
      cVar42 = pcVar1[0xf];
      for (uVar20 = (ushort)(SUB161(auVar24 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar24[0xf] >> 7) << 0xf; uVar20 != 0; uVar20 = uVar20 - 1 & uVar20) {
        local_68._0_2_ = CONCAT11(cVar28,cVar25);
        local_68._0_3_ = CONCAT12(cVar29,(undefined2)local_68);
        local_68._0_4_ = CONCAT13(cVar30,(undefined3)local_68);
        local_68._0_5_ = CONCAT14(cVar31,(undefined4)local_68);
        local_68._0_6_ = CONCAT15(cVar32,(undefined5)local_68);
        local_68._0_7_ = CONCAT16(cVar33,(undefined6)local_68);
        local_68 = CONCAT17(cVar34,(undefined7)local_68);
        cStack_60 = cVar35;
        cStack_5f = cVar36;
        cStack_5e = cVar37;
        cStack_5d = cVar38;
        cStack_5c = cVar39;
        cStack_5b = cVar40;
        cStack_5a = cVar41;
        cStack_59 = cVar42;
        uVar9 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(uVar20);
        local_b0.key = (FieldDescriptor **)local_58._0_8_;
        local_b0.this =
             &common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ;
        ppFVar14 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        sVar15 = seq.offset_;
        uVar21 = uVar9 + seq.offset_ & seq.mask_;
        bVar7 = absl::lts_20250127::container_internal::
                hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,void>
                ::
                apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,google::protobuf::(anonymous_namespace)::ParentNumberHash,google::protobuf::(anonymous_namespace)::ParentNumberEq,std::allocator<google::protobuf::FieldDescriptor_const*>>::EqualElement<google::protobuf::FieldDescriptor_const*>,google::protobuf::FieldDescriptor_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>>
                          ((EqualElement<const_google::protobuf::FieldDescriptor_*> *)&local_b0,
                           ppFVar14 + uVar21);
        if (bVar7) {
          seq._0_16_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::iterator_at(&common->
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ,uVar21);
          local_b0.key = local_98;
          goto LAB_001c8767;
        }
        cVar25 = (ctrl_t)local_68;
        cVar28 = local_68._1_1_;
        cVar29 = local_68._2_1_;
        cVar30 = local_68._3_1_;
        cVar31 = local_68._4_1_;
        cVar32 = local_68._5_1_;
        cVar33 = local_68._6_1_;
        cVar34 = local_68._7_1_;
        cVar35 = cStack_60;
        cVar36 = cStack_5f;
        cVar37 = cStack_5e;
        cVar38 = cStack_5d;
        cVar39 = cStack_5c;
        cVar40 = cStack_5b;
        cVar41 = cStack_5a;
        cVar42 = cStack_59;
      }
      auVar27[0] = -(cVar25 == kEmpty);
      auVar27[1] = -(cVar28 == kEmpty);
      auVar27[2] = -(cVar29 == kEmpty);
      auVar27[3] = -(cVar30 == kEmpty);
      auVar27[4] = -(cVar31 == kEmpty);
      auVar27[5] = -(cVar32 == kEmpty);
      auVar27[6] = -(cVar33 == kEmpty);
      auVar27[7] = -(cVar34 == kEmpty);
      auVar27[8] = -(cVar35 == kEmpty);
      auVar27[9] = -(cVar36 == kEmpty);
      auVar27[10] = -(cVar37 == kEmpty);
      auVar27[0xb] = -(cVar38 == kEmpty);
      auVar27[0xc] = -(cVar39 == kEmpty);
      auVar27[0xd] = -(cVar40 == kEmpty);
      auVar27[0xe] = -(cVar41 == kEmpty);
      auVar27[0xf] = -(cVar42 == kEmpty);
      if ((((((((((((((((auVar27 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar27 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar27 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar27 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar27 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar27 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar27 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar27 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar27 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar42 == kEmpty)
      break;
      uVar21 = seq.index_ + 0x10;
      seq.offset_ = seq.index_ + sVar15 + 0x10 & seq.mask_;
      seq.index_ = uVar21;
      sVar15 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::capacity(&common->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
      if (sVar15 < uVar21) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = const google::protobuf::FieldDescriptor *]"
                     );
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::AssertNotDebugCapacity
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              );
    auVar5._8_8_ = 0;
    auVar5._0_8_ = extraout_RDX_00;
    seq._0_16_ = auVar5 << 0x40;
    local_b0.key = local_98;
  }
LAB_001c8767:
  local_b0.this =
       (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)local_b8;
  bVar7 = absl::lts_20250127::container_internal::operator==
                    ((const_iterator *)&seq,(const_iterator *)&local_b0);
  if (!bVar7) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xfe2,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, Args = <google::protobuf::FieldDescriptor *const &>]"
                 );
  }
  return true;
}

Assistant:

bool FileDescriptorTables::AddFieldByNumber(FieldDescriptor* field) {
  // Skip fields that are at the start of the sequence.
  if (field->containing_type() != nullptr && field->number() >= 1 &&
      field->number() <= field->containing_type()->sequential_field_limit_) {
    if (field->is_extension()) {
      // Conflicts with the field that already exists in the sequential range.
      return false;
    }
    // Only return true if the field at that index matches. Otherwise it
    // conflicts with the existing field in the sequential range.
    return field->containing_type()->field(field->number() - 1) == field;
  }

  return fields_by_number_.insert(field).second;
}